

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filesystem.cc
# Opt level: O0

char * __thiscall phosg::dirname(phosg *this,char *__path)

{
  allocator<char> local_21;
  size_type local_20;
  size_t slash_pos;
  string *filename_local;
  
  slash_pos = (size_t)__path;
  filename_local = (string *)this;
  local_20 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::rfind
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__path,
                        '/',0xffffffffffffffff);
  if (local_20 == 0xffffffffffffffff) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>((string *)this,"",&local_21);
    ::std::allocator<char>::~allocator(&local_21);
  }
  else {
    ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)slash_pos,0,
               local_20);
  }
  return (char *)this;
}

Assistant:

std::string dirname(const std::string& filename) {
  size_t slash_pos = filename.rfind('/');
  return (slash_pos == string::npos) ? "" : filename.substr(0, slash_pos);
}